

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

void __thiscall luna::Table::SetValue(Table *this,Value *key,Value *value)

{
  double __x;
  double dVar1;
  bool bVar2;
  pointer __p;
  iterator __it;
  _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
  *this_01;
  
  if (key->type_ == ValueT_Number) {
    __x = (key->field_0).num_;
    dVar1 = floor(__x);
    if (((dVar1 == __x) && (!NAN(dVar1) && !NAN(__x))) &&
       (bVar2 = SetArrayValue(this,(long)(__x - 9.223372036854776e+18) & (long)__x >> 0x3f |
                                   (long)__x,value), bVar2)) {
      return;
    }
  }
  this_00 = &((this->hash_)._M_t.
              super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
             ._M_head_impl)->_M_h;
  this_01 = &this->hash_;
  if (this_00 ==
      (_Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    if (value->type_ == ValueT_Nil) {
      return;
    }
    __p = (pointer)operator_new(0x38);
    (__p->_M_h)._M_buckets = &(__p->_M_h)._M_single_bucket;
    (__p->_M_h)._M_bucket_count = 1;
    (__p->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p->_M_h)._M_element_count = 0;
    (__p->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__p->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__p->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    std::
    __uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
             *)this_01,__p);
    this_00 = &((this_01->_M_t).
                super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                .
                super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
               ._M_head_impl)->_M_h;
  }
  __it = std::
         _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find(this_00,key);
  if (__it.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>._M_cur ==
      (__node_type *)0x0) {
    if (value->type_ != ValueT_Nil) {
      std::
      _Hashtable<luna::Value,std::pair<luna::Value_const,luna::Value>,std::allocator<std::pair<luna::Value_const,luna::Value>>,std::__detail::_Select1st,std::equal_to<luna::Value>,std::hash<luna::Value>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<luna::Value,luna::Value>>
                ((_Hashtable<luna::Value,std::pair<luna::Value_const,luna::Value>,std::allocator<std::pair<luna::Value_const,luna::Value>>,std::__detail::_Select1st,std::equal_to<luna::Value>,std::hash<luna::Value>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)(this_01->_M_t).
                    super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
                    ._M_head_impl);
    }
  }
  else {
    if (value->type_ == ValueT_Nil) {
      std::
      _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&((this_01->_M_t).
                super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                .
                super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
               ._M_head_impl)->_M_h,
              (const_iterator)
              __it.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>._M_cur
             );
      return;
    }
    *(ValueT *)
     ((long)__it.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>._M_cur +
     0x20) = value->type_;
    *(anon_union_8_9_8deb4486_for_Value_0 *)
     ((long)__it.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>._M_cur +
     0x18) = value->field_0;
  }
  return;
}

Assistant:

void Table::SetValue(const Value &key, const Value &value)
    {
        // Try array part
        if (key.type_ == ValueT_Number && IsInt(key.num_))
        {
            if (SetArrayValue(static_cast<std::size_t>(key.num_), value))
                return ;
        }

        // Hash part
        if (!hash_)
        {
            // If value is nil and hash part is not existed, then do nothing
            if (value.IsNil())
                return ;
            hash_.reset(new Hash);
        }

        auto it = hash_->find(key);
        if (it != hash_->end())
        {
            // If value is nil, then just erase the element
            if (value.IsNil())
                hash_->erase(it);
            else
                it->second = value;
        }
        else
        {
            // If key is not existed and value is not nil, then insert it
            if (!value.IsNil())
                hash_->insert(std::make_pair(key, value));
        }
    }